

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_MessageNodeMissingMsgTypeAttribute::
TestreadFromDocument_MessageNodeMissingMsgTypeAttribute
          (TestreadFromDocument_MessageNodeMissingMsgTypeAttribute *this)

{
  char *suiteName;
  TestreadFromDocument_MessageNodeMissingMsgTypeAttribute *this_local;
  
  suiteName = SuiteDataDictionaryTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"readFromDocument_MessageNodeMissingMsgTypeAttribute",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0x5d8);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestreadFromDocument_MessageNodeMissingMsgTypeAttribute_00457030;
  return;
}

Assistant:

TEST(readFromDocument_MessageNodeMissingMsgTypeAttribute) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field name='BeginString' required='Y' />"
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
          "<field number='93' name='SignatureLength' type='STRING' />"
          "<field number='627' name='NoHops' type='NUMINGROUP' />"
          "<field number='628' name='HopCompID' type='STRING' />"
        "</fields>"
        "<messages>"
          "<message name='Advertisement' msgcat='app' />"  // msgtype attribute missing
        "</messages>"
        "<trailer>"
          "<field name='SignatureLength' required='Y' />"
          "<group name='NoHops' required='N'>"
             "<field name='HopCompID' required='N' />"
          "</group>"
        "</trailer>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}